

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O1

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::StreamRead
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,ssize_t nread)

{
  if (nread < 1) {
    if (-1 < nread) {
      return;
    }
    this->EndOfFile = true;
  }
  else {
    *(long *)&this->field_0x18 = *(long *)&this->field_0x18 + nread;
  }
  uv_read_stop(this->Stream);
  return;
}

Assistant:

void cmBasicUVStreambuf<CharT, Traits>::StreamRead(ssize_t nread)
{
  if (nread > 0) {
    this->setg(this->eback(), this->gptr(),
               this->egptr() + nread / sizeof(CharT));
    uv_read_stop(this->Stream);
  } else if (nread < 0 /*|| nread == UV_EOF*/) {
    this->EndOfFile = true;
    uv_read_stop(this->Stream);
  }
}